

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h262_print.c
# Opt level: O0

void h262_print_seqparm(h262_seqparm *seqparm)

{
  char *pcVar1;
  uint *in_RDI;
  char *astr;
  int i;
  char *local_18;
  int local_c;
  
  pcVar1 = "MPEG1";
  if (in_RDI[0x89] != 0) {
    pcVar1 = "MPEG2";
  }
  printf("%s sequence header:\n",pcVar1);
  printf("\thorizontal_size = %d\n",(ulong)*in_RDI);
  printf("\tvertical_size = %d\n",(ulong)in_RDI[1]);
  local_18 = "???";
  switch(in_RDI[2]) {
  case 1:
    local_18 = "square sample";
    break;
  case 2:
    local_18 = "4:3 display";
    break;
  case 3:
    local_18 = "16:9 display";
    break;
  case 4:
    local_18 = "2.21:1 display";
  }
  printf("\taspect_ratio_information = %d [%s]\n",(ulong)in_RDI[2],local_18);
  printf("\tframe_rate_code = %d\n",(ulong)in_RDI[3]);
  printf("\tbit_rate = %d\n",(ulong)in_RDI[4]);
  printf("\tvbv_buffer_size = %d\n",(ulong)in_RDI[5]);
  printf("\tconstrained_parameters_flag = %d\n",(ulong)in_RDI[6]);
  if (in_RDI[7] != 0) {
    printf("\tintra_quantiser_matrix =");
    for (local_c = 0; local_c < 0x40; local_c = local_c + 1) {
      printf(" %d",(ulong)in_RDI[(long)local_c + 8]);
    }
    printf("\n");
  }
  if (in_RDI[0x48] != 0) {
    printf("\tnon_intra_quantiser_matrix =");
    for (local_c = 0; local_c < 0x40; local_c = local_c + 1) {
      printf(" %d",(ulong)in_RDI[(long)local_c + 0x49]);
    }
    printf("\n");
  }
  if (in_RDI[0x89] != 0) {
    printf("\tprofile_and_level_indication = 0x%02x\n",(ulong)in_RDI[0x8a]);
    printf("\tprogressive_sequence = %d\n",(ulong)in_RDI[0x8b]);
    printf("\tchroma_format = %d\n",(ulong)in_RDI[0x8c]);
    printf("\tlow_delay = %d\n",(ulong)in_RDI[0x8d]);
    printf("\tframe_rate_extension_n = %d\n",(ulong)in_RDI[0x8e]);
    printf("\tframe_rate_extension_d = %d\n",(ulong)in_RDI[0x8f]);
  }
  return;
}

Assistant:

void h262_print_seqparm(struct h262_seqparm *seqparm) {
	int i;
	printf("%s sequence header:\n", seqparm->is_ext?"MPEG2":"MPEG1");
	printf("\thorizontal_size = %d\n", seqparm->horizontal_size);
	printf("\tvertical_size = %d\n", seqparm->vertical_size);
	const char *astr = "???";
	switch (seqparm->aspect_ratio_information) {
		case H262_ASPECT_RATIO_SAMPLE_SQUARE:
			astr = "square sample";
			break;
		case H262_ASPECT_RATIO_DISPLAY_4_3:
			astr = "4:3 display";
			break;
		case H262_ASPECT_RATIO_DISPLAY_16_9:
			astr = "16:9 display";
			break;
		case H262_ASPECT_RATIO_DISPLAY_221_100:
			astr = "2.21:1 display";
			break;
	}
	printf("\taspect_ratio_information = %d [%s]\n", seqparm->aspect_ratio_information, astr);
	printf("\tframe_rate_code = %d\n", seqparm->frame_rate_code);
	printf("\tbit_rate = %d\n", seqparm->bit_rate);
	printf("\tvbv_buffer_size = %d\n", seqparm->vbv_buffer_size);
	printf("\tconstrained_parameters_flag = %d\n", seqparm->constrained_parameters_flag);
	if (seqparm->load_intra_quantiser_matrix) {
		printf("\tintra_quantiser_matrix =");
		for (i = 0; i < 64; i++)
			printf(" %d", seqparm->intra_quantiser_matrix[i]);
		printf("\n");
	}
	if (seqparm->load_non_intra_quantiser_matrix) {
		printf("\tnon_intra_quantiser_matrix =");
		for (i = 0; i < 64; i++)
			printf(" %d", seqparm->non_intra_quantiser_matrix[i]);
		printf("\n");
	}
	if (seqparm->is_ext) {
		printf("\tprofile_and_level_indication = 0x%02x\n", seqparm->profile_and_level_indication);
		printf("\tprogressive_sequence = %d\n", seqparm->progressive_sequence);
		printf("\tchroma_format = %d\n", seqparm->chroma_format);
		printf("\tlow_delay = %d\n", seqparm->low_delay);
		printf("\tframe_rate_extension_n = %d\n", seqparm->frame_rate_extension_n);
		printf("\tframe_rate_extension_d = %d\n", seqparm->frame_rate_extension_d);
	}
}